

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DMipmapTestInstance *this)

{
  CoordType CVar1;
  int blue;
  int iVar2;
  int iVar3;
  TextureFormat format;
  reference pvVar4;
  int *piVar5;
  TestTexture2D *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestContext *pTVar7;
  qpWatchDog *watchDog;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  TextureType TVar10;
  Texture2DView TVar11;
  int local_950;
  int local_94c;
  bool local_945;
  int local_8f4;
  int local_8f0;
  allocator<char> local_8b9;
  string local_8b8;
  byte local_893;
  byte local_892;
  allocator<char> local_891;
  string local_890;
  undefined1 local_86a;
  allocator<char> local_869;
  undefined1 local_868 [6];
  bool isOk;
  allocator<char> local_841;
  string local_840;
  LogImage local_820;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  LogImage local_740;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  LogImage local_660;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  LogImageSet local_580;
  MessageBuilder local_540;
  Texture2DView local_3c0;
  PixelBufferAccess local_3b0;
  PixelBufferAccess local_388;
  PixelBufferAccess local_360;
  ConstPixelBufferAccess local_338;
  PixelBufferAccess local_310;
  ConstPixelBufferAccess local_2e8;
  Texture2DView local_2c0;
  SurfaceAccess local_2b0;
  int local_290;
  int local_28c;
  int cellNdx_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int gridX_1;
  int gridY_1;
  Vector<int,_4> local_260;
  Vector<int,_4> local_250;
  IVec4 local_240;
  tcu local_230 [8];
  float afStack_228 [2];
  Vector<int,_3> local_220;
  Vector<int,_3> local_214;
  int local_208;
  undefined1 local_204 [4];
  int numFailedPixels;
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  Surface errorMask;
  Surface referenceFrame;
  bool isTrilinear;
  PixelFormat pixelFormat;
  undefined1 local_17c [8];
  IVec4 formatBitDepth;
  int cellNdx;
  int curH;
  int curW;
  int curY;
  int curX;
  int gridX;
  int gridY;
  Sampler local_148;
  int local_10c;
  int local_108;
  int cellHeight;
  int cellWidth;
  int gridHeight;
  int gridWidth;
  undefined1 local_f0 [8];
  Surface renderedFrame;
  undefined1 local_d0 [6];
  bool useLodBias;
  bool isProjected;
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams refParams;
  int viewportHeight;
  int viewportWidth;
  FilterMode magFilter;
  Texture2DMipmapTestInstance *this_local;
  
  refParams.maxLevel = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  refParams.baseLevel = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TEXTURETYPE_2D);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_d0);
  renderedFrame.m_pixels.m_cap._7_1_ =
       (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType ==
       COORDTYPE_PROJECTED;
  renderedFrame.m_pixels.m_cap._6_1_ =
       (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType ==
       COORDTYPE_BASIC_BIAS;
  tcu::Surface::Surface((Surface *)local_f0,refParams.maxLevel,refParams.baseLevel);
  cellWidth = 4;
  cellHeight = 4;
  local_108 = refParams.maxLevel;
  if (refParams.maxLevel < 0) {
    local_108 = refParams.maxLevel + 3;
  }
  local_108 = local_108 >> 2;
  local_10c = refParams.baseLevel;
  if (refParams.baseLevel < 0) {
    local_10c = refParams.baseLevel + 3;
  }
  local_10c = local_10c >> 2;
  util::createSampler(&local_148,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_148)
  ;
  format = ::vk::mapVkFormat((this->m_testParameters).super_Texture2DTestCaseParameters.
                             super_TextureCommonTestCaseParameters.format);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = glu::TextureTestUtil::getSamplerType(format);
  TVar10 = TEXTURETYPE_2D;
  if ((renderedFrame.m_pixels.m_cap._6_1_ & 1) != 0) {
    TVar10 = TEXTURETYPE_2D_ARRAY;
  }
  refParams.super_RenderParams.texType = (renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0 | TVar10;
  refParams.sampler.seamlessCubeMap = false;
  refParams.sampler._53_3_ = 0;
  if ((texture::(anonymous_namespace)::Texture2DMipmapTestInstance::iterate()::s_projections == '\0'
      ) && (iVar2 = __cxa_guard_acquire(&texture::(anonymous_namespace)::Texture2DMipmapTestInstance
                                         ::iterate()::s_projections), iVar2 != 0)) {
    tcu::Vector<float,_4>::Vector(iterate::s_projections,1.2,1.0,0.7,1.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 1,1.3,0.8,0.6,2.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 2,0.8,1.0,1.7,0.6);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 3,1.2,1.0,1.7,1.5);
    __cxa_guard_release(&texture::(anonymous_namespace)::Texture2DMipmapTestInstance::iterate()::
                         s_projections);
  }
  curX = 0;
  do {
    if (3 < curX) {
      pixelFormat._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      tcu::getTextureFormatBitDepth((tcu *)local_17c,(TextureFormat *)&pixelFormat.blueBits);
      piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_17c,0);
      iVar2 = *piVar5;
      piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_17c,1);
      iVar3 = *piVar5;
      piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_17c,2);
      blue = *piVar5;
      piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_17c,3);
      tcu::PixelFormat::PixelFormat
                ((PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4),iVar2,iVar3,blue,*piVar5)
      ;
      local_945 = true;
      if ((this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.minFilter != NEAREST_MIPMAP_LINEAR) {
        local_945 = (this->m_testParameters).super_Texture2DTestCaseParameters.
                    super_TextureCommonTestCaseParameters.minFilter == LINEAR_MIPMAP_LINEAR;
      }
      referenceFrame.m_pixels.m_cap._3_1_ = local_945;
      tcu::Surface::Surface
                ((Surface *)&errorMask.m_pixels.m_cap,refParams.maxLevel,refParams.baseLevel);
      tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,refParams.maxLevel,refParams.baseLevel)
      ;
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
      tcu::LodPrecision::LodPrecision((LodPrecision *)local_204,RULE_VULKAN);
      local_208 = 0;
      tcu::Vector<int,_3>::Vector(&local_214,0x14,0x14,0);
      lookupPrec.coordBits.m_data[0] = local_214.m_data[2];
      lodPrec.derivateBits = local_214.m_data[0];
      lodPrec.lodBits = local_214.m_data[1];
      tcu::Vector<int,_3>::Vector(&local_220,0x10,0x10,0);
      lookupPrec.uvwBits.m_data[0] = local_220.m_data[2];
      lookupPrec.coordBits.m_data[1] = local_220.m_data[0];
      lookupPrec.coordBits.m_data[2] = local_220.m_data[1];
      glu::TextureTestUtil::getBitsVec
                ((TextureTestUtil *)&local_260,
                 (PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4));
      tcu::operator-((tcu *)&local_250,&local_260,(referenceFrame.m_pixels.m_cap._3_1_ & 1) + 1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&gridY_1,0);
      tcu::max<int,4>((tcu *)&local_240,&local_250,(Vector<int,_4> *)&gridY_1);
      tcu::computeFixedPointThreshold(local_230,&local_240);
      lookupPrec.uvwBits.m_data._4_8_ = local_230;
      lookupPrec.colorThreshold.m_data[0] = afStack_228[0];
      lookupPrec.colorThreshold.m_data[1] = afStack_228[1];
      glu::TextureTestUtil::getCompareMask
                ((TextureTestUtil *)&gridX_1,
                 (PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4));
      lookupPrec.colorThreshold.m_data[2] = (float)gridX_1;
      numFailedPixels = 10;
      lodPrec.rule = 8;
      if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
        lodPrec.rule = 6;
      }
      curX_1 = 0;
      do {
        if (3 < curX_1) {
          if (0 < local_208) {
            pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
            pTVar8 = tcu::TestContext::getLog(pTVar7);
            tcu::TestLog::operator<<(&local_540,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_540,(char (*) [41])"ERROR: Image verification failed, found "
                               );
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_208);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])" invalid pixels!");
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_540);
          }
          pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
          pTVar8 = tcu::TestContext::getLog(pTVar7);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a0,"Result",&local_5a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c8,"Verification result",&local_5c9);
          tcu::LogImageSet::LogImageSet(&local_580,&local_5a0,&local_5c8);
          pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_580);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_680,"Rendered",&local_681);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6a8,"Rendered image",&local_6a9);
          tcu::LogImage::LogImage
                    (&local_660,&local_680,&local_6a8,(Surface *)local_f0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(pTVar8,&local_660);
          tcu::LogImage::~LogImage(&local_660);
          std::__cxx11::string::~string((string *)&local_6a8);
          std::allocator<char>::~allocator(&local_6a9);
          std::__cxx11::string::~string((string *)&local_680);
          std::allocator<char>::~allocator(&local_681);
          tcu::LogImageSet::~LogImageSet(&local_580);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::allocator<char>::~allocator(&local_5c9);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::allocator<char>::~allocator(&local_5a1);
          if (0 < local_208) {
            pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
            pTVar8 = tcu::TestContext::getLog(pTVar7);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_760,"Reference",&local_761);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_788,"Ideal reference",&local_789);
            tcu::LogImage::LogImage
                      (&local_740,&local_760,&local_788,(Surface *)&errorMask.m_pixels.m_cap,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_740);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_840,"ErrorMask",&local_841);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_868,"Error mask",&local_869);
            tcu::LogImage::LogImage
                      (&local_820,&local_840,(string *)local_868,(Surface *)&lookupPrec.colorMask,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::TestLog::operator<<(pTVar8,&local_820);
            tcu::LogImage::~LogImage(&local_820);
            std::__cxx11::string::~string((string *)local_868);
            std::allocator<char>::~allocator(&local_869);
            std::__cxx11::string::~string((string *)&local_840);
            std::allocator<char>::~allocator(&local_841);
            tcu::LogImage::~LogImage(&local_740);
            std::__cxx11::string::~string((string *)&local_788);
            std::allocator<char>::~allocator(&local_789);
            std::__cxx11::string::~string((string *)&local_760);
            std::allocator<char>::~allocator(&local_761);
          }
          pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
          pTVar8 = tcu::TestContext::getLog(pTVar7);
          tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
          local_86a = local_208 == 0;
          local_892 = 0;
          local_893 = 0;
          if ((bool)local_86a) {
            std::allocator<char>::allocator();
            local_892 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_890,"pass",&local_891);
            local_893 = 1;
            tcu::TestStatus::pass(__return_storage_ptr__,&local_890);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8b8,"fail",&local_8b9);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_8b8);
            std::__cxx11::string::~string((string *)&local_8b8);
            std::allocator<char>::~allocator(&local_8b9);
          }
          if ((local_893 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_890);
          }
          if ((local_892 & 1) != 0) {
            std::allocator<char>::~allocator(&local_891);
          }
          tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
          tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
          tcu::Surface::~Surface((Surface *)local_f0);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_d0);
          return __return_storage_ptr__;
        }
        for (curY_1 = 0; curY_1 < 4; curY_1 = curY_1 + 1) {
          curW_1 = local_108 * curY_1;
          curH_1 = local_10c * curX_1;
          if (curY_1 == 3) {
            local_94c = refParams.maxLevel - curW_1;
          }
          else {
            local_94c = local_108;
          }
          cellNdx_1 = local_94c;
          if (curX_1 == 3) {
            local_950 = refParams.baseLevel - curH_1;
          }
          else {
            local_950 = local_10c;
          }
          local_28c = local_950;
          local_290 = curY_1 + curX_1 * 4;
          CVar1 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
          if (CVar1 < COORDTYPE_AFFINE) {
LAB_00ed265d:
            getBasicTexCoord2D((vector<float,_std::allocator<float>_> *)local_d0,local_290);
          }
          else if (CVar1 == COORDTYPE_AFFINE) {
            getAffineTexCoord2D((vector<float,_std::allocator<float>_> *)local_d0,local_290);
          }
          else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_00ed265d;
          if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
            refParams.super_RenderParams.samplerType =
                 (SamplerType)iterate::s_projections[local_290 % 4].m_data[0];
            refParams.super_RenderParams.flags =
                 (deUint32)iterate::s_projections[local_290 % 4].m_data[1];
            refParams.super_RenderParams.w.m_data._0_8_ =
                 *(undefined8 *)(iterate::s_projections[local_290 % 4].m_data + 2);
          }
          if ((renderedFrame.m_pixels.m_cap._6_1_ & 1) != 0) {
            refParams.super_RenderParams.w.m_data[2] = iterate::s_bias[local_290 % 8];
          }
          tcu::SurfaceAccess::SurfaceAccess
                    (&local_2b0,(Surface *)&errorMask.m_pixels.m_cap,
                     (PixelFormat *)((long)&referenceFrame.m_pixels.m_cap + 4),curW_1,curH_1,
                     cellNdx_1,local_28c);
          pTVar6 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(&this->m_texture);
          iVar2 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0x11])();
          TVar11 = tcu::Texture2D::operator_cast_to_Texture2DView
                             ((Texture2D *)CONCAT44(extraout_var,iVar2));
          local_2c0.m_levels = TVar11.m_levels;
          local_2c0.m_numLevels = TVar11.m_numLevels;
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_d0,0);
          glu::TextureTestUtil::sampleTexture
                    (&local_2b0,&local_2c0,pvVar4,
                     (ReferenceParams *)
                     &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          tcu::Surface::getAccess(&local_310,(Surface *)local_f0);
          tcu::getSubregion((PixelBufferAccess *)&local_2e8,&local_310,curW_1,curH_1,cellNdx_1,
                            local_28c);
          tcu::Surface::getAccess(&local_360,(Surface *)&errorMask.m_pixels.m_cap);
          tcu::getSubregion((PixelBufferAccess *)&local_338,&local_360,curW_1,curH_1,cellNdx_1,
                            local_28c);
          tcu::Surface::getAccess(&local_3b0,(Surface *)&lookupPrec.colorMask);
          tcu::getSubregion(&local_388,&local_3b0,curW_1,curH_1,cellNdx_1,local_28c);
          pTVar6 = de::SharedPtr<vkt::pipeline::TestTexture2D>::operator->(&this->m_texture);
          iVar2 = (*(pTVar6->super_TestTexture)._vptr_TestTexture[0x11])();
          TVar11 = tcu::Texture2D::operator_cast_to_Texture2DView
                             ((Texture2D *)CONCAT44(extraout_var_00,iVar2));
          local_3c0.m_levels = TVar11.m_levels;
          local_3c0.m_numLevels = TVar11.m_numLevels;
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_d0,0);
          pTVar7 = Context::getTestContext((this->super_TestInstance).m_context);
          watchDog = tcu::TestContext::getWatchDog(pTVar7);
          iVar2 = glu::TextureTestUtil::computeTextureLookupDiff
                            (&local_2e8,&local_338,&local_388,&local_3c0,pvVar4,
                             (ReferenceParams *)
                             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_204,
                             watchDog);
          local_208 = iVar2 + local_208;
        }
        curX_1 = curX_1 + 1;
      } while( true );
    }
    for (curY = 0; curY < 4; curY = curY + 1) {
      iVar2 = local_108 * curY;
      iVar3 = local_10c * curX;
      if (curY == 3) {
        local_8f0 = refParams.maxLevel - iVar2;
      }
      else {
        local_8f0 = local_108;
      }
      if (curX == 3) {
        local_8f4 = refParams.baseLevel - iVar3;
      }
      else {
        local_8f4 = local_10c;
      }
      formatBitDepth.m_data[3] = local_8f4;
      formatBitDepth.m_data[2] = curY + curX * 4;
      CVar1 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
      if (CVar1 < COORDTYPE_AFFINE) {
LAB_00ed2135:
        getBasicTexCoord2D((vector<float,_std::allocator<float>_> *)local_d0,
                           formatBitDepth.m_data[2]);
      }
      else if (CVar1 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D((vector<float,_std::allocator<float>_> *)local_d0,
                            formatBitDepth.m_data[2]);
      }
      else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_00ed2135;
      if ((renderedFrame.m_pixels.m_cap._7_1_ & 1) != 0) {
        refParams.super_RenderParams.samplerType =
             (SamplerType)iterate::s_projections[formatBitDepth.m_data[2] % 4].m_data[0];
        refParams.super_RenderParams.flags =
             (deUint32)iterate::s_projections[formatBitDepth.m_data[2] % 4].m_data[1];
        refParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)(iterate::s_projections[formatBitDepth.m_data[2] % 4].m_data + 2);
      }
      if ((renderedFrame.m_pixels.m_cap._6_1_ & 1) != 0) {
        refParams.super_RenderParams.w.m_data[2] = iterate::s_bias[formatBitDepth.m_data[2] % 8];
      }
      util::TextureRenderer::setViewport
                (&this->m_renderer,(float)iVar2,(float)iVar3,(float)local_8f0,
                 (float)formatBitDepth.m_data[3]);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_d0,0);
      util::TextureRenderer::renderQuad
                (&this->m_renderer,(Surface *)local_f0,0,pvVar4,
                 (ReferenceParams *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    curX = curX + 1;
  } while( true );
}

Assistant:

tcu::TestStatus Texture2DMipmapTestInstance::iterate (void)
{
	const Sampler::FilterMode	magFilter		= Sampler::NEAREST;
	const int					viewportWidth	= m_renderer.getRenderWidth();
	const int					viewportHeight	= m_renderer.getRenderHeight();

	ReferenceParams				refParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth		= 4;
	const int					gridHeight		= 4;
	const int					cellWidth		= viewportWidth / gridWidth;
	const int					cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_testParameters.coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log.
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_testParameters.minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_testParameters.minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_testParameters.coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  m_texture->getTexture(), &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}